

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EstimatorUtilStats.h
# Opt level: O2

void WriteRawData(FILE *f,vector<Estimates,_std::allocator<Estimates>_> *estimates)

{
  pointer pEVar1;
  Estimates *est;
  pointer pEVar2;
  
  fwrite("triangle_estimate,fraction_of_edges_seen,fraction_of_vertices_seen\n",0x43,1,(FILE *)f);
  pEVar1 = (estimates->super__Vector_base<Estimates,_std::allocator<Estimates>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pEVar2 = (estimates->super__Vector_base<Estimates,_std::allocator<Estimates>_>)._M_impl.
                super__Vector_impl_data._M_start; pEVar2 != pEVar1; pEVar2 = pEVar2 + 1) {
    fprintf((FILE *)f,"%.3lf,%.6lf,%.6lf\n",pEVar2->estimate,pEVar2->fraction_of_edges_seen,
            pEVar2->fraction_of_vertices_seen);
  }
  return;
}

Assistant:

void WriteRawData (FILE *f, std::vector<Estimates> const &estimates) {
    fprintf(f, "triangle_estimate,fraction_of_edges_seen,fraction_of_vertices_seen\n");
    for (auto & est : estimates) {
        fprintf(f, "%.3lf,%.6lf,%.6lf\n", est.estimate, est.fraction_of_edges_seen,
                est.fraction_of_vertices_seen);
    }
}